

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# capi.c
# Opt level: O2

void NGA_Set_block_cyclic_proc_grid64(int g_a,int64_t *block,int64_t *proc_grid)

{
  Integer IVar1;
  long lVar2;
  long lVar3;
  int64_t *piVar4;
  Integer _proc_grid [7];
  Integer _block [7];
  Integer aIStack_98 [7];
  int64_t iStack_60;
  Integer local_58 [8];
  
  IVar1 = pnga_get_dimension((long)g_a);
  lVar3 = 0;
  lVar2 = 0;
  if (0 < IVar1) {
    lVar2 = IVar1;
  }
  piVar4 = &iStack_60 + IVar1;
  for (; lVar2 != lVar3; lVar3 = lVar3 + 1) {
    *piVar4 = block[lVar3];
    piVar4 = piVar4 + -1;
  }
  piVar4 = aIStack_98 + IVar1;
  for (lVar3 = 0; piVar4 = piVar4 + -1, lVar2 != lVar3; lVar3 = lVar3 + 1) {
    *piVar4 = proc_grid[lVar3];
  }
  pnga_set_block_cyclic_proc_grid((long)g_a,local_58,aIStack_98);
  return;
}

Assistant:

void NGA_Set_block_cyclic_proc_grid64(int g_a, int64_t block[], int64_t proc_grid[])
{
    Integer aa, ndim;
    Integer _block[MAXDIM];
    Integer _proc_grid[MAXDIM];
    aa = (Integer)g_a;
    ndim = wnga_get_dimension(aa);
    COPYC2F(block,_block, ndim);
    COPYC2F(proc_grid, _proc_grid, ndim);
    wnga_set_block_cyclic_proc_grid(aa, _block, _proc_grid);
}